

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O2

void xmlFAParsePosCharGroup(xmlRegParserCtxtPtr ctxt)

{
  uchar *utf;
  xmlChar *pxVar1;
  uchar uVar2;
  byte bVar3;
  xmlChar xVar4;
  uint start;
  uint end;
  int neg;
  char *extra;
  xmlRegAtomPtr atom;
  xmlChar *pxVar5;
  int local_34;
  
  pxVar5 = ctxt->cur;
  xVar4 = *pxVar5;
  do {
    if (xVar4 == '\\') {
      xmlFAParseCharClassEsc(ctxt);
    }
    else {
      if ((xVar4 == ']') || (xVar4 == '[')) {
        ctxt->error = 0x5aa;
        extra = "Expecting a char range";
      }
      else if (xVar4 == '\0') {
        ctxt->error = 0x5aa;
        extra = "Expecting \']\'";
      }
      else {
        local_34 = 4;
        start = xmlGetUTF8Char(pxVar5,&local_34);
        if ((int)start < 0) {
LAB_00175805:
          ctxt->error = 0x5aa;
          extra = "Invalid UTF-8";
        }
        else {
          pxVar5 = ctxt->cur;
          if ((((start == 0x2d) && (pxVar5[1] != ']')) && (pxVar5[-1] != '[')) &&
             (pxVar5[-1] != '^')) {
            ctxt->cur = pxVar5 + local_34;
            goto LAB_001756b5;
          }
          pxVar1 = pxVar5 + local_34;
          ctxt->cur = pxVar1;
          if (((pxVar5[local_34] != '-') || (pxVar1[1] == ']')) || (pxVar1[1] == '[')) {
            atom = ctxt->atom;
            neg = ctxt->neg;
            end = start;
LAB_00175755:
            xmlRegAtomAddRange(ctxt,atom,neg,XML_REGEXP_CHARVAL,start,end,(xmlChar *)0x0);
            goto LAB_001756b5;
          }
          utf = pxVar1 + 1;
          ctxt->cur = utf;
          uVar2 = *utf;
          if (((uVar2 == '\0') || (uVar2 == '[')) || (uVar2 == ']')) {
            ctxt->error = 0x5aa;
            extra = "Expecting the end of a char range";
          }
          else {
            if (uVar2 == '\\') {
              ctxt->cur = pxVar1 + 2;
              bVar3 = pxVar1[2];
              if (((bVar3 - 0x28 < 0x37) &&
                  ((0x7800000080006fU >> ((ulong)(bVar3 - 0x28) & 0x3f) & 1) != 0)) ||
                 (bVar3 - 0x7b < 3)) {
                end = (uint)bVar3;
              }
              else {
                end = 10;
                if (bVar3 != 0x6e) {
                  if (bVar3 == 0x74) {
                    end = 9;
                  }
                  else {
                    if (bVar3 != 0x72) {
                      ctxt->error = 0x5aa;
                      extra = "Invalid escape value";
                      goto LAB_001756b0;
                    }
                    end = 0xd;
                  }
                }
              }
              local_34 = 1;
            }
            else {
              local_34 = 4;
              end = xmlGetUTF8Char(utf,&local_34);
              if ((int)end < 0) goto LAB_00175805;
            }
            if (start <= end) {
              ctxt->cur = ctxt->cur + local_34;
              atom = ctxt->atom;
              neg = ctxt->neg;
              goto LAB_00175755;
            }
            ctxt->error = 0x5aa;
            extra = "End of range is before start of range";
          }
        }
      }
LAB_001756b0:
      xmlRegexpErrCompile(ctxt,extra);
    }
LAB_001756b5:
    pxVar5 = ctxt->cur;
    xVar4 = *pxVar5;
    if (((xVar4 == '\0') || (xVar4 == '-')) || ((xVar4 == ']' || (ctxt->error != 0)))) {
      return;
    }
  } while( true );
}

Assistant:

static void
xmlFAParsePosCharGroup(xmlRegParserCtxtPtr ctxt) {
    do {
	if (CUR == '\\') {
	    xmlFAParseCharClassEsc(ctxt);
	} else {
	    xmlFAParseCharRange(ctxt);
	}
    } while ((CUR != ']') && (CUR != '-') &&
             (CUR != 0) && (ctxt->error == 0));
}